

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

ExactFloat * __thiscall
ExactFloat::ToStringWithMaxDigits_abi_cxx11_(ExactFloat *this,int max_digits)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  ulong uVar7;
  int in_EDX;
  undefined4 in_register_00000034;
  ExactFloat *this_00;
  char cVar8;
  int local_e4;
  int i_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  char *local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  int local_ac;
  char local_a8 [4];
  int i;
  char exp_buf [20];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_6d;
  int local_6c;
  string local_68 [4];
  int exp10;
  string digits;
  allocator local_47;
  allocator local_46;
  allocator local_45 [20];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_1d;
  int local_1c;
  ExactFloat *pEStack_18;
  int max_digits_local;
  ExactFloat *this_local;
  string *str;
  
  this_00 = (ExactFloat *)CONCAT44(in_register_00000034,max_digits);
  local_31 = 0;
  local_1c = in_EDX;
  pEStack_18 = this_00;
  this_local = this;
  if (in_EDX < 1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x172,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar3 = S2LogMessage::stream(&local_30);
    poVar3 = std::operator<<(poVar3,"Check failed: (max_digits) > (0) ");
    S2LogMessageVoidify::operator&(&local_1d,poVar3);
  }
  if ((local_31 & 1) == 0) {
    bVar2 = is_normal(this_00);
    if (bVar2) {
      std::__cxx11::string::string(local_68);
      local_6c = GetDecimalDigits(this_00,local_1c,(string *)local_68);
      local_6d = 0;
      std::__cxx11::string::string((string *)this);
      cVar8 = (char)this;
      if (this_00->sign_ < 0) {
        std::__cxx11::string::push_back(cVar8);
      }
      if ((local_6c < -3) || (local_1c < local_6c)) {
        std::__cxx11::string::operator[]((ulong)local_68);
        std::__cxx11::string::push_back(cVar8);
        uVar5 = std::__cxx11::string::size();
        if (1 < uVar5) {
          std::__cxx11::string::push_back(cVar8);
          local_80._M_current = (char *)std::__cxx11::string::begin();
          local_78 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&local_80,1);
          _Var6._M_current = (char *)std::__cxx11::string::end();
          std::__cxx11::string::
          append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((string *)this,local_78,_Var6);
        }
        sprintf(local_a8,"e%+02d",(ulong)(local_6c - 1));
        std::__cxx11::string::operator+=((string *)this,local_a8);
      }
      else if (local_6c < 1) {
        std::__cxx11::string::operator+=((string *)this,"0.");
        for (local_e4 = local_6c; local_e4 < 0; local_e4 = local_e4 + 1) {
          std::__cxx11::string::push_back(cVar8);
        }
        std::__cxx11::string::operator+=((string *)this,local_68);
      }
      else {
        uVar5 = (ulong)local_6c;
        uVar7 = std::__cxx11::string::size();
        if (uVar5 < uVar7) {
          local_b8._M_current = (char *)std::__cxx11::string::begin();
          local_c8._M_current = (char *)std::__cxx11::string::begin();
          local_c0 = (char *)__gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator+(&local_c8,(long)local_6c);
          std::__cxx11::string::
          append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((string *)this,local_b8,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_c0);
          std::__cxx11::string::push_back(cVar8);
          local_d8._M_current = (char *)std::__cxx11::string::begin();
          local_d0 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&local_d8,(long)local_6c);
          _Var6._M_current = (char *)std::__cxx11::string::end();
          std::__cxx11::string::
          append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((string *)this,local_d0,_Var6);
        }
        else {
          std::__cxx11::string::operator+=((string *)this,local_68);
          iVar1 = local_6c;
          local_ac = std::__cxx11::string::size();
          for (local_ac = iVar1 - local_ac; 0 < local_ac; local_ac = local_ac + -1) {
            std::__cxx11::string::push_back(cVar8);
          }
        }
      }
      local_6d = 1;
      std::__cxx11::string::~string(local_68);
    }
    else {
      bVar2 = is_nan(this_00);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,"nan",local_45);
        std::allocator<char>::~allocator((allocator<char> *)local_45);
      }
      else {
        bVar2 = is_zero(this_00);
        if (bVar2) {
          pcVar4 = "0";
          if (this_00->sign_ < 0) {
            pcVar4 = "-0";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,pcVar4,&local_46);
          std::allocator<char>::~allocator((allocator<char> *)&local_46);
        }
        else {
          pcVar4 = "inf";
          if (this_00->sign_ < 0) {
            pcVar4 = "-inf";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,pcVar4,&local_47);
          std::allocator<char>::~allocator((allocator<char> *)&local_47);
        }
      }
    }
    return this;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

string ExactFloat::ToStringWithMaxDigits(int max_digits) const {
  S2_DCHECK_GT(max_digits, 0);
  if (!is_normal()) {
    if (is_nan()) return "nan";
    if (is_zero()) return (sign_ < 0) ? "-0" : "0";
    return (sign_ < 0) ? "-inf" : "inf";
  }
  string digits;
  int exp10 = GetDecimalDigits(max_digits, &digits);
  string str;
  if (sign_ < 0) str.push_back('-');

  // We use the standard '%g' formatting rules.  If the exponent is less than
  // -4 or greater than or equal to the requested precision (i.e., max_digits)
  // then we use exponential notation.
  //
  // But since "exp10" is the base-10 exponent corresponding to a mantissa in
  // the range [0.1, 1), whereas the '%g' rules assume a mantissa in the range
  // [1.0, 10), we need to adjust these parameters by 1.
  if (exp10 <= -4 || exp10 > max_digits) {
    // Use exponential format.
    str.push_back(digits[0]);
    if (digits.size() > 1) {
      str.push_back('.');
      str.append(digits.begin() + 1, digits.end());
    }
    char exp_buf[20];
    sprintf(exp_buf, "e%+02d", exp10 - 1);
    str += exp_buf;
  } else {
    // Use fixed format.  We split this into two cases depending on whether
    // the integer portion is non-zero or not.
    if (exp10 > 0) {
      if (exp10 >= digits.size()) {
        str += digits;
        for (int i = exp10 - digits.size(); i > 0; --i) {
          str.push_back('0');
        }
      } else {
        str.append(digits.begin(), digits.begin() + exp10);
        str.push_back('.');
        str.append(digits.begin() + exp10, digits.end());
      }
    } else {
      str += "0.";
      for (int i = exp10; i < 0; ++i) {
        str.push_back('0');
      }
      str += digits;
    }
  }
  return str;
}